

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

Section QDateTimeEditPrivate::convertToPublic(Section s)

{
  Section SVar1;
  
  SVar1 = s & 0xfffeffff;
  if ((int)SVar1 < 0x100) {
    if (SVar1 < 0x21) {
      if ((0x116UL >> ((ulong)SVar1 & 0x3f) & 1) != 0) {
        return SVar1;
      }
      if ((0x100010000U >> ((ulong)SVar1 & 0x3f) & 1) != 0) {
        return HourSection;
      }
    }
    return NoSection;
  }
  if ((int)SVar1 < 0x800) {
    if (SVar1 == DaySection) {
      return DaySection;
    }
    if (SVar1 == MonthSection) {
      return SVar1;
    }
    if (SVar1 != YearSection) {
      return NoSection;
    }
  }
  else if (SVar1 != 0x800) {
    if (SVar1 == 0x2000) {
      return DaySection;
    }
    if (SVar1 != 0x1000) {
      return NoSection;
    }
    return DaySection;
  }
  return YearSection;
}

Assistant:

QDateTimeEdit::Section QDateTimeEditPrivate::convertToPublic(QDateTimeParser::Section s)
{
    switch (s & ~Internal) {
    case AmPmSection: return QDateTimeEdit::AmPmSection;
    case MSecSection: return QDateTimeEdit::MSecSection;
    case SecondSection: return QDateTimeEdit::SecondSection;
    case MinuteSection: return QDateTimeEdit::MinuteSection;
    case DayOfWeekSectionShort:
    case DayOfWeekSectionLong:
    case DaySection: return QDateTimeEdit::DaySection;
    case MonthSection: return QDateTimeEdit::MonthSection;
    case YearSection2Digits:
    case YearSection: return QDateTimeEdit::YearSection;
    case Hour12Section:
    case Hour24Section: return QDateTimeEdit::HourSection;
    case FirstSection:
    case NoSection:
    case LastSection: break;
    }
    return QDateTimeEdit::NoSection;
}